

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp.cpp
# Opt level: O3

void save_component_to_files
               (TRIPLEBYTES **mrx,BITMAPFILEHEADER bmFile,BITMAPINFOHEADER bmInfo,int component,
               char *filename)

{
  undefined1 auVar1 [16];
  u_char uVar2;
  TRIPLERGB **matrix;
  TRIPLERGB *pTVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  uchar *puVar7;
  long lVar8;
  
  lVar8 = (long)(int)bmInfo.biHeight;
  uVar5 = lVar8 * 8;
  if (lVar8 < 0) {
    uVar5 = 0xffffffffffffffff;
  }
  matrix = (TRIPLERGB **)operator_new__(uVar5);
  if (lVar8 < 1) {
    saveBMPFile(bmFile,bmInfo,matrix,filename);
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)(int)bmInfo.biWidth;
    uVar5 = SUB168(auVar1 * ZEXT816(3),0);
    if (SUB168(auVar1 * ZEXT816(3),8) != 0) {
      uVar5 = 0xffffffffffffffff;
    }
    lVar6 = 0;
    do {
      pTVar3 = (TRIPLERGB *)operator_new__(uVar5);
      matrix[lVar6] = pTVar3;
      if (0 < (int)bmInfo.biWidth) {
        puVar7 = &pTVar3->red;
        uVar4 = 0;
        do {
          uVar2 = getComponent(mrx,(int)lVar6,(int)uVar4,component);
          ((TRIPLERGB *)(puVar7 + -2))->blue = uVar2;
          puVar7[-1] = uVar2;
          *puVar7 = uVar2;
          uVar4 = uVar4 + 1;
          puVar7 = puVar7 + 3;
        } while (bmInfo.biWidth != uVar4);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != lVar8);
    saveBMPFile(bmFile,bmInfo,matrix,filename);
    if (0 < (int)bmInfo.biHeight) {
      lVar6 = 0;
      do {
        if (matrix[lVar6] != (TRIPLERGB *)0x0) {
          operator_delete__(matrix[lVar6]);
        }
        lVar6 = lVar6 + 1;
      } while (lVar8 != lVar6);
    }
  }
  operator_delete__(matrix);
  return;
}

Assistant:

void save_component_to_files(TRIPLEBYTES **mrx, BITMAPFILEHEADER bmFile, BITMAPINFOHEADER bmInfo, int component,
                             const char *filename) {
    int height = bmInfo.biHeight;
    int width = bmInfo.biWidth;
    TRIPLERGB **mrxComponent = new TRIPLERGB *[height];
    for (int i = 0; i < height; i++) {
        mrxComponent[i] = new TRIPLERGB[width];
        for (int j = 0; j < width; j++) {
            mrxComponent[i][j].red = mrxComponent[i][j].green = mrxComponent[i][j].blue = getComponent(mrx, i, j,
                                                                                                       component);
        }
    }
    saveBMPFile(bmFile, bmInfo, mrxComponent, filename);
    for (int i = 0; i < height; i++) {
        delete[] mrxComponent[i];
    }
    delete[] mrxComponent;
}